

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O0

int mriStep_SetNonlinRDiv(ARKodeMem ark_mem,sunrealtype rdiv)

{
  ARKodeMem in_XMM0_Qa;
  int retval;
  ARKodeMRIStepMem step_mem;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = mriStep_AccessStepMem
                      (in_XMM0_Qa,in_stack_ffffffffffffffe0,
                       (ARKodeMRIStepMem *)
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (local_4 == 0) {
    if (0.0 < (double)in_XMM0_Qa) {
      *(ARKodeMem *)(in_stack_ffffffffffffffe0 + 0xe0) = in_XMM0_Qa;
    }
    else {
      builtin_strncpy(in_stack_ffffffffffffffe0 + 0xe0,"ffffff\x02@",8);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mriStep_SetNonlinRDiv(ARKodeMem ark_mem, sunrealtype rdiv)
{
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* if argument legal set it, otherwise set default */
  if (rdiv <= ZERO) { step_mem->rdiv = RDIV; }
  else { step_mem->rdiv = rdiv; }

  return (ARK_SUCCESS);
}